

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

RsProdSyntax * __thiscall slang::parsing::Parser::parseRsProd(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  RsProdItemSyntax *pRVar3;
  RsCodeBlockSyntax *pRVar4;
  ExpressionSyntax *pEVar5;
  RsProdItemSyntax *item;
  RsElseClauseSyntax *elseClause;
  RsCaseSyntax *pRVar6;
  RsIfElseSyntax *pRVar7;
  Token TVar8;
  Token TVar9;
  Token TVar10;
  Token keyword;
  
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar8.kind;
  if (TVar2 == RepeatKeyword) {
    TVar8 = ParserBase::consume(&this->super_ParserBase);
    TVar9 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    pEVar5 = parseExpression(this);
    TVar10 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    pRVar3 = parseRsProdItem(this);
    pRVar7 = (RsIfElseSyntax *)
             slang::syntax::SyntaxFactory::rsRepeat(&this->factory,TVar8,TVar9,pEVar5,TVar10,pRVar3)
    ;
  }
  else {
    if (TVar2 == OpenBrace) {
      pRVar4 = parseRsCodeBlock(this);
      return &pRVar4->super_RsProdSyntax;
    }
    if (TVar2 == CaseKeyword) {
      pRVar6 = parseRsCase(this);
      return &pRVar6->super_RsProdSyntax;
    }
    if (TVar2 == IfKeyword) {
      TVar8 = ParserBase::consume(&this->super_ParserBase);
      TVar9 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      pEVar5 = parseExpression(this);
      TVar10 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pRVar3 = parseRsProdItem(this);
      bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
      if (bVar1) {
        keyword = ParserBase::consume(&this->super_ParserBase);
        item = parseRsProdItem(this);
        elseClause = slang::syntax::SyntaxFactory::rsElseClause(&this->factory,keyword,item);
      }
      else {
        elseClause = (RsElseClauseSyntax *)0x0;
      }
      pRVar7 = slang::syntax::SyntaxFactory::rsIfElse
                         (&this->factory,TVar8,TVar9,pEVar5,TVar10,pRVar3,elseClause);
    }
    else {
      if (TVar2 == Identifier) {
        pRVar3 = parseRsProdItem(this);
        return &pRVar3->super_RsProdSyntax;
      }
      pRVar7 = (RsIfElseSyntax *)0x0;
    }
  }
  return &pRVar7->super_RsProdSyntax;
}

Assistant:

RsProdSyntax* Parser::parseRsProd() {
    switch (peek().kind) {
        case TokenKind::Identifier:
            return &parseRsProdItem();
        case TokenKind::IfKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& condition = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& ifItem = parseRsProdItem();

            RsElseClauseSyntax* elseClause = nullptr;
            if (peek(TokenKind::ElseKeyword)) {
                auto elseKeyword = consume();
                auto& elseItem = parseRsProdItem();
                elseClause = &factory.rsElseClause(elseKeyword, elseItem);
            }

            return &factory.rsIfElse(keyword, openParen, condition, closeParen, ifItem, elseClause);
        }
        case TokenKind::RepeatKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& item = parseRsProdItem();

            return &factory.rsRepeat(keyword, openParen, expr, closeParen, item);
        }
        case TokenKind::CaseKeyword:
            return &parseRsCase();
        case TokenKind::OpenBrace:
            return &parseRsCodeBlock();
        default:
            return nullptr;
    }
}